

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedMeshControl.cpp
# Opt level: O1

void __thiscall TPZMHMixedMeshControl::BuildMultiPhysicsMesh(TPZMHMixedMeshControl *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  TPZCompMesh *pTVar3;
  long lVar4;
  TPZCompEl *pTVar5;
  _Base_ptr p_Var6;
  TPZCompEl **ppTVar7;
  TPZGeoEl *pTVar8;
  TPZGeoEl **ppTVar9;
  _Base_ptr p_Var10;
  _Rb_tree_header *p_Var11;
  long lVar12;
  set<int,_std::less<int>,_std::allocator<int>_> matids;
  TPZManVector<TPZCompMesh_*,_10> meshvec;
  TPZStack<long,_10> gelindexes;
  TPZManVector<long,_10> shouldcreate;
  TPZMultiphysicsCompMesh *local_1c0;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_1b8;
  TPZManVector<TPZCompMesh_*,_10> local_188;
  TPZManVector<long,_10> local_118;
  TPZManVector<long,_10> local_a0;
  
  if ((((this->super_TPZMHMeshControl).fCMesh.fRef)->fPointer->fElementVec).
      super_TPZChunkVector<TPZCompEl_*,_10>.fNElements != 0) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
               ,0x546);
  }
  TPZCreateApproximationSpace::SetAllCreateFunctionsMultiphysicElem
            (&((this->super_TPZMHMeshControl).fCMesh.fRef)->fPointer->fCreate);
  pTVar3 = ((this->super_TPZMHMeshControl).fCMesh.fRef)->fPointer;
  if (pTVar3 == (TPZCompMesh *)0x0) {
    local_1c0 = (TPZMultiphysicsCompMesh *)0x0;
  }
  else {
    local_1c0 = (TPZMultiphysicsCompMesh *)
                __dynamic_cast(pTVar3,&TPZCompMesh::typeinfo,&TPZMultiphysicsCompMesh::typeinfo,0);
  }
  TPZManVector<TPZCompMesh_*,_10>::TPZManVector
            (&local_188,(ulong)((this->super_TPZMHMeshControl).fNState < 2) ^ 3);
  *local_188.super_TPZVec<TPZCompMesh_*>.fStore = ((this->fFluxMesh).fRef)->fPointer;
  local_188.super_TPZVec<TPZCompMesh_*>.fStore[1] =
       ((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer;
  if (1 < (this->super_TPZMHMeshControl).fNState) {
    local_188.super_TPZVec<TPZCompMesh_*>.fStore[2] = ((this->fRotationMesh).fRef)->fPointer;
  }
  local_118.super_TPZVec<long>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<long,_10>::TPZManVector
            (&local_a0,
             (((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fElementVec).
             super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements,(long *)&local_118);
  p_Var1 = &local_1b8._M_impl.super__Rb_tree_header;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1b8._M_impl.super__Rb_tree_header._M_node_count = 0;
  pTVar3 = ((this->super_TPZMHMeshControl).fCMesh.fRef)->fPointer;
  p_Var6 = (pTVar3->fMaterialVec)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var11 = &(pTVar3->fMaterialVec)._M_t._M_impl.super__Rb_tree_header;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_1b8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  if ((_Rb_tree_header *)p_Var6 != p_Var11) {
    do {
      local_118.super_TPZVec<long>._vptr_TPZVec = *(_func_int ***)(p_Var6 + 1);
      local_118.super_TPZVec<long>.fStore = (long *)p_Var6[1]._M_parent;
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                 &local_1b8,(int *)&local_118);
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var11);
  }
  lVar4 = (((this->fFluxMesh).fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.
          fNElements;
  if (0 < lVar4) {
    lVar12 = 0;
    do {
      ppTVar7 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(((this->fFluxMesh).fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZCompEl_*,_10>,lVar12);
      pTVar5 = *ppTVar7;
      pTVar8 = TPZCompEl::Reference(pTVar5);
      iVar2 = pTVar8->fMatId;
      p_Var10 = &p_Var1->_M_header;
      for (p_Var6 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent;
          (_Rb_tree_header *)p_Var6 != (_Rb_tree_header *)0x0;
          p_Var6 = (&p_Var6->_M_left)[(int)*(size_t *)(p_Var6 + 1) < iVar2]) {
        if (iVar2 <= (int)*(size_t *)(p_Var6 + 1)) {
          p_Var10 = p_Var6;
        }
      }
      p_Var11 = p_Var1;
      if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
         (p_Var11 = (_Rb_tree_header *)p_Var10,
         iVar2 < (int)((_Rb_tree_header *)p_Var10)->_M_node_count)) {
        p_Var11 = p_Var1;
      }
      if (p_Var11 == p_Var1) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
                   ,0x55e);
      }
      pTVar8 = TPZCompEl::Reference(pTVar5);
      local_a0.super_TPZVec<long>.fStore[pTVar8->fIndex] = 1;
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar4);
  }
  lVar4 = (((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer->fElementVec).
          super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  if (0 < lVar4) {
    lVar12 = 0;
    do {
      ppTVar7 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                          (&(((this->super_TPZMHMeshControl).fPressureFineMesh.fRef)->fPointer->
                            fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>,lVar12);
      pTVar5 = *ppTVar7;
      pTVar8 = TPZCompEl::Reference(pTVar5);
      iVar2 = pTVar8->fMatId;
      p_Var10 = &p_Var1->_M_header;
      for (p_Var6 = local_1b8._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < iVar2]) {
        if (iVar2 <= (int)p_Var6[1]._M_color) {
          p_Var10 = p_Var6;
        }
      }
      p_Var6 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
         (p_Var6 = p_Var10, iVar2 < (int)p_Var10[1]._M_color)) {
        p_Var6 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var6 == p_Var1) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMixedMeshControl.cpp"
                   ,0x569);
      }
      pTVar8 = TPZCompEl::Reference(pTVar5);
      local_a0.super_TPZVec<long>.fStore[pTVar8->fIndex] = 1;
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar4);
  }
  lVar4 = (((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fElementVec).
          super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  if (0 < lVar4) {
    lVar12 = 0;
    do {
      ppTVar9 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                          (&(((this->super_TPZMHMeshControl).fGMesh.fRef)->fPointer->fElementVec).
                            super_TPZChunkVector<TPZGeoEl_*,_10>,lVar12);
      if (local_a0.super_TPZVec<long>.fStore[lVar12] != 0) {
        for (pTVar8 = TPZGeoEl::Father(*ppTVar9); pTVar8 != (TPZGeoEl *)0x0;
            pTVar8 = TPZGeoEl::Father(pTVar8)) {
          if (local_a0.super_TPZVec<long>.fStore[pTVar8->fIndex] == 1) {
            local_a0.super_TPZVec<long>.fStore[pTVar8->fIndex] = 0;
          }
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != lVar4);
  }
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&local_118);
  if (0 < lVar4) {
    lVar12 = 0;
    do {
      if (local_a0.super_TPZVec<long>.fStore[lVar12] != 0) {
        TPZStack<long,_10>::Push((TPZStack<long,_10> *)&local_118,lVar12);
      }
      lVar12 = lVar12 + 1;
    } while (lVar4 != lVar12);
  }
  TPZMultiphysicsCompMesh::BuildMultiphysicsSpace
            (local_1c0,&local_188.super_TPZVec<TPZCompMesh_*>,&local_118.super_TPZVec<long>);
  TPZManVector<long,_10>::~TPZManVector(&local_118);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_1b8);
  TPZManVector<long,_10>::~TPZManVector(&local_a0);
  if (local_188.super_TPZVec<TPZCompMesh_*>.fStore == local_188.fExtAlloc) {
    local_188.super_TPZVec<TPZCompMesh_*>.fStore = (TPZCompMesh **)0x0;
  }
  local_188.super_TPZVec<TPZCompMesh_*>.fNAlloc = 0;
  local_188.super_TPZVec<TPZCompMesh_*>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183bb70;
  if (local_188.super_TPZVec<TPZCompMesh_*>.fStore != (TPZCompMesh **)0x0) {
    operator_delete__(local_188.super_TPZVec<TPZCompMesh_*>.fStore);
  }
  return;
}

Assistant:

void TPZMHMixedMeshControl::BuildMultiPhysicsMesh()
{
    if (fCMesh->NElements() != 0) {
        DebugStop();
    }
    fCMesh->SetAllCreateFunctionsMultiphysicElem();
    TPZMultiphysicsCompMesh *mphysics = dynamic_cast<TPZMultiphysicsCompMesh *>(fCMesh.operator->());
    int vecsize = 2;
    if(fNState > 1) vecsize = 3;
    TPZManVector<TPZCompMesh *> meshvec(vecsize);
    meshvec[0] = fFluxMesh.operator->();
    meshvec[1] = fPressureFineMesh.operator->();
    if(fNState > 1)
    {
        meshvec[2] = this->fRotationMesh.operator->();
    }
    TPZManVector<int64_t> shouldcreate(fGMesh->NElements(),0);
    std::set<int> matids;
    for (auto it : fCMesh->MaterialVec()) {
        matids.insert(it.first);
    }
    int64_t nel = fFluxMesh->NElements();
    for (int64_t el = 0; el<nel; el++) {
        TPZCompEl *cel = fFluxMesh->Element(el);
        TPZGeoEl *gel = cel->Reference();
        // this means that all geometric elements associated with flux elements will generate a computational element
        if (matids.find(gel->MaterialId()) == matids.end()) {
            DebugStop();
        }
        if (cel) {
            shouldcreate[cel->Reference()->Index()] = 1;
        }
    }
    nel = fPressureFineMesh->NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZCompEl *cel = fPressureFineMesh->Element(el);
        TPZGeoEl *gel = cel->Reference();
        if (matids.find(gel->MaterialId()) == matids.end()) {
            DebugStop();
        }
        if (cel) {
            shouldcreate[cel->Reference()->Index()] = 1;
        }
    }
    // define the intersection of the finest references
    nel = fGMesh->NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = fGMesh->Element(el);
        if (shouldcreate[el])
        {
            TPZGeoEl *fat = gel->Father();
            while(fat)
            {
                if(shouldcreate[fat->Index()] == 1)
                {
                    shouldcreate[fat->Index()] = 0;
                }
                fat = fat->Father();
            }
        }
    }
    TPZStack<int64_t> gelindexes;
    for (int64_t el=0; el<nel; el++) {
        if (shouldcreate[el])
        {
            gelindexes.Push(el);
        }
    }
#ifdef PZ_LOG
    if(logger.isDebugEnabled())
    {
        std::stringstream sout;
        sout << "Geometric indices for which we will create multiphysics elements" << std::endl;
        sout << gelindexes;
//        std::cout << sout.str() << std::endl;
        LOGPZ_DEBUG(logger, sout.str())
    }
#endif
    mphysics->BuildMultiphysicsSpace(meshvec,gelindexes);

}